

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ExternalCommand.cpp
# Opt level: O2

bool __thiscall
llbuild::buildsystem::ExternalCommand::canUpdateIfNewerWithResult
          (ExternalCommand *this,BuildValue *result)

{
  bool bVar1;
  uint uVar2;
  FileInfo *this_00;
  uint n;
  bool bVar3;
  
  n = 0;
  bVar3 = false;
  if (this->allowModifiedOutputs == true) {
    uVar2 = BuildValue::getNumOutputs(result);
    do {
      bVar3 = uVar2 == n;
      if (bVar3) {
        return bVar3;
      }
      this_00 = BuildValue::getNthOutputInfo(result,n);
      bVar1 = llbuild::basic::FileInfo::isMissing(this_00);
      n = n + 1;
    } while (!bVar1);
  }
  return bVar3;
}

Assistant:

bool ExternalCommand::canUpdateIfNewerWithResult(const BuildValue& result) {
  // Unless `allowModifiedOutputs` is specified, we always need to update if
  // ran.
  if (!allowModifiedOutputs)
    return false;

  // If it was specified, then we can update if all of our outputs simply exist.
  for (unsigned i = 0, e = result.getNumOutputs(); i != e; ++i) {
    const FileInfo& outputInfo = result.getNthOutputInfo(i);

    // If the output is missing, we need to rebuild.
    if (outputInfo.isMissing())
      return false;
  }
  return true;
}